

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::maybe<toml::detail::character<'\''>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  size_type sVar5;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region local_f8;
  result<toml::detail::region,_toml::detail::none_t> local_b0;
  region local_60;
  
  character<'\''>::invoke(&local_b0,loc);
  if (local_b0.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region::region(&(__return_storage_ptr__->field_1).succ.value,&local_b0.field_1.succ.value);
  }
  else {
    region::region(&local_60,loc);
    sVar5 = local_60.source_name_._M_string_length;
    _Var4._M_pi = local_60.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar3 = local_60.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_f8.source_name_._M_dataplus._M_p = (pointer)&local_f8.source_name_.field_2;
    local_f8.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001a47c0;
    paVar2 = &local_60.source_name_.field_2;
    local_60.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_60.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.source_name_._M_dataplus._M_p == paVar2) {
      local_f8.source_name_.field_2._8_8_ = local_60.source_name_.field_2._8_8_;
      local_60.source_name_._M_dataplus._M_p = local_f8.source_name_._M_dataplus._M_p;
    }
    local_f8.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_60.source_name_.field_2._M_allocated_capacity._1_7_;
    local_f8.source_name_.field_2._M_local_buf[0] = local_60.source_name_.field_2._M_local_buf[0];
    local_60.source_name_._M_string_length = 0;
    local_60.source_name_.field_2._M_local_buf[0] = '\0';
    local_f8.first_._M_current = local_60.first_._M_current;
    local_f8.last_._M_current = local_60.last_._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_001a47c0;
    local_f8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    local_f8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
    if (local_60.source_name_._M_dataplus._M_p == local_f8.source_name_._M_dataplus._M_p) {
      paVar1->_M_allocated_capacity = local_f8.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8)
           = local_f8.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
           local_60.source_name_._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
           local_f8.source_name_.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar5;
    local_f8.source_name_._M_string_length = 0;
    local_f8.source_name_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_60.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_60.first_._M_current;
    (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_60.last_._M_current;
    local_60.source_name_._M_dataplus._M_p = (pointer)paVar2;
    region::~region(&local_f8);
    region::~region(&local_60);
  }
  if (local_b0.is_ok_ == true) {
    region::~region(&local_b0.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            return rslt;
        }
        return ok(region(loc));
    }